

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O3

char * SHA256_End(SHA256_CTX *context,char *buffer)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  char *pcVar3;
  long lVar4;
  sha2_byte *d;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 local_38 [32];
  
  if (context == (SHA256_CTX *)0x0) {
    __assert_fail("context != (SHA256_CTX*)0",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sha2.c",
                  0x275,"char *SHA256_End(SHA256_CTX *, char *)");
  }
  if (buffer == (char *)0x0) {
    pcVar3 = (char *)0x0;
    auVar10 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    *(undefined1 (*) [64])context->buffer = auVar10;
    auVar10 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    context->state[0] = auVar10._0_4_;
    context->state[1] = auVar10._4_4_;
    context->state[2] = auVar10._8_4_;
    context->state[3] = auVar10._12_4_;
    context->state[4] = auVar10._16_4_;
    context->state[5] = auVar10._20_4_;
    context->state[6] = auVar10._24_4_;
    context->state[7] = auVar10._28_4_;
    context->bitcount = auVar10._32_8_;
    context->buffer[0] = auVar10[0x28];
    context->buffer[1] = auVar10[0x29];
    context->buffer[2] = auVar10[0x2a];
    context->buffer[3] = auVar10[0x2b];
    context->buffer[4] = auVar10[0x2c];
    context->buffer[5] = auVar10[0x2d];
    context->buffer[6] = auVar10[0x2e];
    context->buffer[7] = auVar10[0x2f];
    context->buffer[8] = auVar10[0x30];
    context->buffer[9] = auVar10[0x31];
    context->buffer[10] = auVar10[0x32];
    context->buffer[0xb] = auVar10[0x33];
    context->buffer[0xc] = auVar10[0x34];
    context->buffer[0xd] = auVar10[0x35];
    context->buffer[0xe] = auVar10[0x36];
    context->buffer[0xf] = auVar10[0x37];
    context->buffer[0x10] = auVar10[0x38];
    context->buffer[0x11] = auVar10[0x39];
    context->buffer[0x12] = auVar10[0x3a];
    context->buffer[0x13] = auVar10[0x3b];
    context->buffer[0x14] = auVar10[0x3c];
    context->buffer[0x15] = auVar10[0x3d];
    context->buffer[0x16] = auVar10[0x3e];
    context->buffer[0x17] = auVar10[0x3f];
  }
  else {
    SHA256_Final(local_38,(SHA256_CTX *)context);
    auVar2._8_8_ = 0x1020408000000000;
    auVar2._0_8_ = 0x1020408000000000;
    auVar2._16_8_ = 0x1020408000000000;
    auVar2._24_8_ = 0x1020408000000000;
    auVar9 = vgf2p8affineqb_avx512vl(local_38,auVar2,0);
    auVar2 = vpmovzxbw_avx2(auVar9._16_16_);
    auVar10 = vpmovzxwq_avx512f(auVar2._0_16_);
    auVar9 = vpmovzxbw_avx2(auVar9._0_16_);
    auVar11 = vpmovzxwq_avx512f(auVar2._16_16_);
    auVar12 = vpmovzxwq_avx512f(auVar9._0_16_);
    auVar13 = vpmovzxwq_avx512f(auVar9._16_16_);
    lVar5 = vpextrq_avx(auVar10._0_16_,1);
    lVar4 = vpextrq_avx(auVar12._0_16_,1);
    auVar1 = vpinsrb_avx(ZEXT116((byte)"0123456789abcdef"[auVar10._0_8_]),
                         (uint)(byte)"0123456789abcdef"[lVar5],1);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar10._16_8_],2);
    lVar5 = vpextrq_avx(auVar10._16_16_,1);
    auVar6 = vextracti32x4_avx512f(auVar10,2);
    auVar7 = vextracti32x4_avx512f(auVar10,3);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],3);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar6._0_8_],4);
    lVar5 = vpextrq_avx(auVar6,1);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],5);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar7._0_8_],6);
    lVar5 = vpextrq_avx(auVar7,1);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],7);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar11._0_8_],8);
    lVar5 = vpextrq_avx(auVar11._0_16_,1);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],9);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar11._16_8_],10);
    lVar5 = vpextrq_avx(auVar11._16_16_,1);
    auVar6 = vextracti32x4_avx512f(auVar11,2);
    auVar7 = vextracti32x4_avx512f(auVar11,3);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],0xb);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar6._0_8_],0xc);
    lVar5 = vpextrq_avx(auVar6,1);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],0xd);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar7._0_8_],0xe);
    lVar5 = vpextrq_avx(auVar7,1);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],0xf);
    auVar6 = vpinsrb_avx(ZEXT116((byte)"0123456789abcdef"[auVar12._0_8_]),
                         (uint)(byte)"0123456789abcdef"[lVar4],1);
    auVar14._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar1;
    auVar14._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    auVar1 = vpinsrb_avx(auVar6,(uint)(byte)"0123456789abcdef"[auVar12._16_8_],2);
    lVar5 = vpextrq_avx(auVar12._16_16_,1);
    auVar6 = vextracti32x4_avx512f(auVar12,2);
    auVar7 = vextracti32x4_avx512f(auVar12,3);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],3);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar6._0_8_],4);
    lVar5 = vpextrq_avx(auVar6,1);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],5);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar7._0_8_],6);
    lVar5 = vpextrq_avx(auVar7,1);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],7);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar13._0_8_],8);
    lVar5 = vpextrq_avx(auVar13._0_16_,1);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],9);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar13._16_8_],10);
    lVar5 = vpextrq_avx(auVar13._16_16_,1);
    auVar6 = vextracti32x4_avx512f(auVar13,2);
    auVar7 = vextracti32x4_avx512f(auVar13,3);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],0xb);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar6._0_8_],0xc);
    lVar5 = vpextrq_avx(auVar6,1);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],0xd);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar7._0_8_],0xe);
    lVar5 = vpextrq_avx(auVar7,1);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],0xf);
    auVar15[8] = 0xf;
    auVar15._0_8_ = 0xf0f0f0f0f0f0f0f;
    auVar15[9] = 0xf;
    auVar15[10] = 0xf;
    auVar15[0xb] = 0xf;
    auVar15[0xc] = 0xf;
    auVar15[0xd] = 0xf;
    auVar15[0xe] = 0xf;
    auVar15[0xf] = 0xf;
    auVar15[0x10] = 0xf;
    auVar15[0x11] = 0xf;
    auVar15[0x12] = 0xf;
    auVar15[0x13] = 0xf;
    auVar15[0x14] = 0xf;
    auVar15[0x15] = 0xf;
    auVar15[0x16] = 0xf;
    auVar15[0x17] = 0xf;
    auVar15[0x18] = 0xf;
    auVar15[0x19] = 0xf;
    auVar15[0x1a] = 0xf;
    auVar15[0x1b] = 0xf;
    auVar15[0x1c] = 0xf;
    auVar15[0x1d] = 0xf;
    auVar15[0x1e] = 0xf;
    auVar15[0x1f] = 0xf;
    auVar2 = vpand_avx2(local_38,auVar15);
    auVar9 = vpmovzxbw_avx2(auVar2._0_16_);
    auVar2 = vpmovzxbw_avx2(auVar2._16_16_);
    auVar10 = vpmovzxwq_avx512f(auVar2._0_16_);
    auVar11 = vpmovzxwq_avx512f(auVar2._16_16_);
    lVar5 = vpextrq_avx(auVar10._0_16_,1);
    auVar6 = vpinsrb_avx(ZEXT116((byte)"0123456789abcdef"[auVar10._0_8_]),
                         (uint)(byte)"0123456789abcdef"[lVar5],1);
    auVar6 = vpinsrb_avx(auVar6,(uint)(byte)"0123456789abcdef"[auVar10._16_8_],2);
    lVar5 = vpextrq_avx(auVar10._16_16_,1);
    auVar7 = vextracti32x4_avx512f(auVar10,2);
    auVar8 = vextracti32x4_avx512f(auVar10,3);
    auVar6 = vpinsrb_avx(auVar6,(uint)(byte)"0123456789abcdef"[lVar5],3);
    auVar6 = vpinsrb_avx(auVar6,(uint)(byte)"0123456789abcdef"[auVar7._0_8_],4);
    lVar5 = vpextrq_avx(auVar7,1);
    auVar10 = vpmovzxwq_avx512f(auVar9._0_16_);
    auVar12 = vpmovzxwq_avx512f(auVar9._16_16_);
    auVar6 = vpinsrb_avx(auVar6,(uint)(byte)"0123456789abcdef"[lVar5],5);
    lVar4 = vpextrq_avx(auVar10._0_16_,1);
    auVar6 = vpinsrb_avx(auVar6,(uint)(byte)"0123456789abcdef"[auVar8._0_8_],6);
    lVar5 = vpextrq_avx(auVar8,1);
    auVar6 = vpinsrb_avx(auVar6,(uint)(byte)"0123456789abcdef"[lVar5],7);
    auVar6 = vpinsrb_avx(auVar6,(uint)(byte)"0123456789abcdef"[auVar11._0_8_],8);
    lVar5 = vpextrq_avx(auVar11._0_16_,1);
    auVar6 = vpinsrb_avx(auVar6,(uint)(byte)"0123456789abcdef"[lVar5],9);
    auVar6 = vpinsrb_avx(auVar6,(uint)(byte)"0123456789abcdef"[auVar11._16_8_],10);
    lVar5 = vpextrq_avx(auVar11._16_16_,1);
    auVar7 = vextracti32x4_avx512f(auVar11,2);
    auVar8 = vextracti32x4_avx512f(auVar11,3);
    auVar6 = vpinsrb_avx(auVar6,(uint)(byte)"0123456789abcdef"[lVar5],0xb);
    auVar6 = vpinsrb_avx(auVar6,(uint)(byte)"0123456789abcdef"[auVar7._0_8_],0xc);
    lVar5 = vpextrq_avx(auVar7,1);
    auVar6 = vpinsrb_avx(auVar6,(uint)(byte)"0123456789abcdef"[lVar5],0xd);
    auVar6 = vpinsrb_avx(auVar6,(uint)(byte)"0123456789abcdef"[auVar8._0_8_],0xe);
    lVar5 = vpextrq_avx(auVar8,1);
    auVar6 = vpinsrb_avx(auVar6,(uint)(byte)"0123456789abcdef"[lVar5],0xf);
    auVar7 = vpinsrb_avx(ZEXT116((byte)"0123456789abcdef"[auVar10._0_8_]),
                         (uint)(byte)"0123456789abcdef"[lVar4],1);
    auVar9._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar14._0_16_;
    auVar9._16_16_ = ZEXT116(0) * auVar14._16_16_ + ZEXT116(1) * auVar6;
    auVar11 = vinserti64x4_avx512f(ZEXT1664(auVar1),auVar14,1);
    auVar13 = vmovdqa64_avx512f(_DAT_00134680);
    auVar1 = vpinsrb_avx(auVar7,(uint)(byte)"0123456789abcdef"[auVar10._16_8_],2);
    lVar5 = vpextrq_avx(auVar10._16_16_,1);
    auVar6 = vextracti32x4_avx512f(auVar10,2);
    auVar7 = vextracti32x4_avx512f(auVar10,3);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],3);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar6._0_8_],4);
    lVar5 = vpextrq_avx(auVar6,1);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],5);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar7._0_8_],6);
    lVar5 = vpextrq_avx(auVar7,1);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],7);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar12._0_8_],8);
    lVar5 = vpextrq_avx(auVar12._0_16_,1);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],9);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar12._16_8_],10);
    lVar5 = vpextrq_avx(auVar12._16_16_,1);
    auVar6 = vextracti32x4_avx512f(auVar12,2);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],0xb);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar6._0_8_],0xc);
    lVar5 = vpextrq_avx(auVar6,1);
    auVar6 = vextracti32x4_avx512f(auVar12,3);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],0xd);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[auVar6._0_8_],0xe);
    lVar5 = vpextrq_avx(auVar6,1);
    auVar1 = vpinsrb_avx(auVar1,(uint)(byte)"0123456789abcdef"[lVar5],0xf);
    pcVar3 = buffer + 0x40;
    auVar10 = vinserti64x4_avx512f(ZEXT1664(auVar1),auVar9,1);
    auVar10 = vpermi2b_avx512_vbmi(auVar13,auVar11,auVar10);
    auVar10 = vmovdqu64_avx512f(auVar10);
    *(undefined1 (*) [64])buffer = auVar10;
    buffer[0x40] = '\0';
  }
  return pcVar3;
}

Assistant:

char *SHA256_End(SHA256_CTX* context, char buffer[SHA256_DIGEST_STRING_LENGTH]) {
	sha2_byte	digest[SHA256_DIGEST_LENGTH], *d = digest;
	int		i;

	/* Sanity check: */
	assert(context != (SHA256_CTX*)0);

	if (buffer != (char*)0) {
		SHA256_Final(digest, context);

		for (i = 0; i < SHA256_DIGEST_LENGTH; i++) {
			*buffer++ = sha2_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha2_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		MEMSET_BZERO(context, sizeof(SHA256_CTX));
	}
	MEMSET_BZERO(digest, SHA256_DIGEST_LENGTH);
	return buffer;
}